

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O2

wchar_t compare_monsters(monster *mon1,monster *mon2)

{
  wchar_t wVar1;
  monster_race *pmVar2;
  monster_race *pmVar3;
  
  pmVar2 = mon1->original_race;
  if (pmVar2 == (monster_race *)0x0) {
    pmVar2 = mon1->race;
  }
  pmVar3 = mon2->original_race;
  if (pmVar3 == (monster_race *)0x0) {
    pmVar3 = mon2->race;
  }
  wVar1 = L'\xffffffff';
  if ((uint)pmVar3->mexp <= (uint)pmVar2->mexp) {
    wVar1 = (wchar_t)((uint)pmVar3->mexp < (uint)pmVar2->mexp);
  }
  return wVar1;
}

Assistant:

static int compare_monsters(const struct monster *mon1,
							const struct monster *mon2)
{
	uint32_t mexp1 = (mon1->original_race) ?
		mon1->original_race->mexp : mon1->race->mexp;
	uint32_t mexp2 = (mon2->original_race) ?
		mon2->original_race->mexp : mon2->race->mexp;

	/* Compare */
	if (mexp1 < mexp2) return (-1);
	if (mexp1 > mexp2) return (1);

	/* Assume equal */
	return (0);
}